

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

FIOBJ headers2str(http_s *h,uintptr_t padding)

{
  uintptr_t uVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  FIOBJ dest;
  ulong uVar5;
  FIOBJ FVar6;
  fiobj_object_vtable_s *pfVar7;
  char *pcVar8;
  fio_str_info_s ret;
  header_writer_s w;
  fio_str_info_s local_48;
  FIOBJ local_30 [3];
  
  if ((h->method == 0) && (h->status_str != 0)) {
    return 0;
  }
  if (headers2str::connection_hash == 0) {
    headers2str::connection_hash = fio_siphash13("connection",10,0x1456f2,0x145bc9);
  }
  sVar4 = fiobj_hash_count((h->private_data).out_headers);
  dest = fiobj_str_buf(padding + sVar4 * 0x40);
  uVar1 = (h->private_data).flag;
  local_30[0] = dest;
  if (*(char *)(uVar1 + 0x101) == '\0') {
    if (((h->status < 100) || (uVar5 = h->status - 100, 0x19b < uVar5)) ||
       (pcVar8 = *(char **)(http1pr_status2str_status2str + uVar5 * 0x18 + 0x10),
       pcVar8 == (char *)0x0)) {
      sVar4 = 0x24;
      pcVar8 = "HTTP/1.1 500 Internal Server Error\r\n";
    }
    else {
      sVar4 = *(size_t *)(http1pr_status2str_status2str + uVar5 * 0x18 + 8);
    }
    fiobj_str_write(dest,pcVar8,sVar4);
    FVar6 = fiobj_hash_get2((h->private_data).out_headers,headers2str::connection_hash);
    if (FVar6 == 0) {
      FVar6 = fiobj_hash_get2(h->headers,headers2str::connection_hash);
      if (FVar6 == 0) {
        uVar5 = h->version;
        if (uVar5 == 0) {
LAB_00151021:
          local_48.data = anon_var_dwarf_20c;
          local_48.len._0_4_ = 4;
          goto LAB_00151034;
        }
        cVar2 = (char)uVar5;
        if ((uVar5 & 1) == 0) {
          switch((uint)uVar5 & 6) {
          case 0:
            cVar2 = *(char *)(uVar5 & 0xfffffffffffffff8);
LAB_00150e5d:
            switch(cVar2) {
            case '\'':
              pfVar7 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_00150e52_caseD_2;
            case ')':
              pfVar7 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_00150e52_caseD_4;
            case '+':
              pfVar7 = &FIOBJECT_VTABLE_DATA;
              break;
            default:
              pfVar7 = &FIOBJECT_VTABLE_NUMBER;
            }
            break;
          case 2:
switchD_00150e52_caseD_2:
            pfVar7 = &FIOBJECT_VTABLE_STRING;
            break;
          case 4:
switchD_00150e52_caseD_4:
            pfVar7 = &FIOBJECT_VTABLE_HASH;
            break;
          case 6:
            if (cVar2 == '&') {
              local_48.data = anon_var_dwarf_217;
              local_48.len._0_4_ = 5;
            }
            else {
              uVar3 = (uint)uVar5 & 0xff;
              if (uVar3 != 0x16) {
                if (uVar3 == 6) goto LAB_00151021;
                goto LAB_00150e5d;
              }
              local_48.data = anon_var_dwarf_222;
              local_48.len._0_4_ = 4;
            }
LAB_00151034:
            local_48.capa._0_4_ = 0;
            local_48.capa._4_4_ = 0;
            local_48.len._4_4_ = 0;
            goto LAB_00151038;
          }
          (*pfVar7->to_str)(&local_48,uVar5);
        }
        else {
          fio_ltocstr(&local_48,(long)uVar5 >> 1);
        }
LAB_00151038:
        if (((((byte *)local_48.data != (byte *)0x0 &&
              7 < CONCAT44(local_48.len._4_4_,(undefined4)local_48.len)) &&
              *(char *)(uVar1 + 0x100) == '\0') && (local_48.data[5] == 0x31)) &&
           ((local_48.data[6] == 0x2e && (local_48.data[7] == 0x31)))) goto LAB_00150d96;
      }
      else {
        cVar2 = (char)FVar6;
        if ((FVar6 & 1) == 0) {
          switch((uint)FVar6 & 6) {
          case 0:
            cVar2 = *(char *)(FVar6 & 0xfffffffffffffff8);
LAB_00150dea:
            switch(cVar2) {
            case '\'':
              pfVar7 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_00150ddf_caseD_2;
            case ')':
              pfVar7 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_00150ddf_caseD_4;
            case '+':
              pfVar7 = &FIOBJECT_VTABLE_DATA;
              break;
            default:
              pfVar7 = &FIOBJECT_VTABLE_NUMBER;
            }
            break;
          case 2:
switchD_00150ddf_caseD_2:
            pfVar7 = &FIOBJECT_VTABLE_STRING;
            break;
          case 4:
switchD_00150ddf_caseD_4:
            pfVar7 = &FIOBJECT_VTABLE_HASH;
            break;
          case 6:
            if (cVar2 == '&') {
              local_48.data = anon_var_dwarf_217;
              local_48.len._0_4_ = 5;
            }
            else {
              uVar3 = (uint)FVar6 & 0xff;
              if (uVar3 == 0x16) {
                local_48.data = anon_var_dwarf_222;
                local_48.len._0_4_ = 4;
              }
              else {
                if (uVar3 != 6) goto LAB_00150dea;
                local_48.data = anon_var_dwarf_20c;
                local_48.len._0_4_ = 4;
              }
            }
            local_48.len._4_4_ = 0;
            local_48.capa._4_4_ = 0;
            local_48.capa._0_4_ = 0;
            goto LAB_00150f2d;
          }
          (*pfVar7->to_str)(&local_48,FVar6);
        }
        else {
          fio_ltocstr(&local_48,(long)FVar6 >> 1);
        }
LAB_00150f2d:
        if ((((byte *)local_48.data == (byte *)0x0) ||
            (CONCAT44(local_48.len._4_4_,(undefined4)local_48.len) == 0)) ||
           ((byte)(*local_48.data | 0x20U) == 0x6b)) goto LAB_00150d96;
      }
      fiobj_str_write(dest,"connection:close\r\n",0x12);
    }
    else {
      cVar2 = (char)FVar6;
      if ((FVar6 & 1) == 0) {
        switch((uint)FVar6 & 6) {
        case 0:
          cVar2 = *(char *)(FVar6 & 0xfffffffffffffff8);
LAB_00150c69:
          switch(cVar2) {
          case '\'':
            pfVar7 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case '(':
            goto switchD_00150c5e_caseD_2;
          case ')':
            pfVar7 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case '*':
            goto switchD_00150c5e_caseD_4;
          case '+':
            pfVar7 = &FIOBJECT_VTABLE_DATA;
            break;
          default:
            pfVar7 = &FIOBJECT_VTABLE_NUMBER;
          }
          break;
        case 2:
switchD_00150c5e_caseD_2:
          pfVar7 = &FIOBJECT_VTABLE_STRING;
          break;
        case 4:
switchD_00150c5e_caseD_4:
          pfVar7 = &FIOBJECT_VTABLE_HASH;
          break;
        case 6:
          if (cVar2 == '&') {
            local_48.data = anon_var_dwarf_217;
            local_48.len._0_4_ = 5;
          }
          else {
            uVar3 = (uint)FVar6 & 0xff;
            if (uVar3 == 0x16) {
              local_48.data = anon_var_dwarf_222;
              local_48.len._0_4_ = 4;
            }
            else {
              if (uVar3 != 6) goto LAB_00150c69;
              local_48.data = anon_var_dwarf_20c;
              local_48.len._0_4_ = 4;
            }
          }
          local_48.len._4_4_ = 0;
          local_48.capa._4_4_ = 0;
          local_48.capa._0_4_ = 0;
          goto LAB_00150eb4;
        }
        (*pfVar7->to_str)(&local_48,FVar6);
      }
      else {
        fio_ltocstr(&local_48,(long)FVar6 >> 1);
      }
LAB_00150eb4:
      if ((byte)(*local_48.data | 0x20U) != 99) goto LAB_00151096;
    }
    *(undefined1 *)(uVar1 + 0x100) = 1;
  }
  else {
    if (h->method == 0) {
      pcVar8 = "GET ";
      sVar4 = 4;
    }
    else {
      fiobj_str_concat(dest,h->method);
      pcVar8 = " ";
      sVar4 = 1;
    }
    fiobj_str_write(dest,pcVar8,sVar4);
    fiobj_str_concat(dest,h->path);
    if (h->query != 0) {
      fiobj_str_write(dest,"?",1);
      fiobj_str_concat(dest,h->query);
    }
    fiobj_str_write(dest," HTTP/1.1\r\n",0xb);
    if (headers2str::host_hash == 0) {
      headers2str::host_hash = fio_siphash13("host",4,0x1456f2,0x145bc9);
    }
    FVar6 = fiobj_hash_get2((h->private_data).out_headers,headers2str::host_hash);
    if ((FVar6 == 0) && (FVar6 = fiobj_hash_get2(h->headers,headers2str::host_hash), FVar6 != 0)) {
      fiobj_str_write(dest,"host:",5);
      fiobj_str_concat(dest,FVar6);
      fiobj_str_write(dest,"\r\n",2);
    }
    FVar6 = fiobj_hash_get2((h->private_data).out_headers,headers2str::connection_hash);
    if (FVar6 == 0) {
LAB_00150d96:
      fiobj_str_write(dest,"connection:keep-alive\r\n",0x17);
    }
  }
LAB_00151096:
  uVar5 = (h->private_data).out_headers;
  uVar3 = (uint)uVar5 & 6;
  if (((uVar3 == 6) || (uVar5 == 0)) || ((uVar5 & 1) != 0)) goto LAB_0015116d;
  if ((uVar5 & 6) == 0) {
    switch(*(undefined1 *)(uVar5 & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar7 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_001510f4_caseD_28;
    case 0x29:
      pfVar7 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_001510f4_caseD_2a;
    case 0x2b:
      pfVar7 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar7 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar3 == 2) {
switchD_001510f4_caseD_28:
    pfVar7 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_001510f4_caseD_2a:
    pfVar7 = &FIOBJECT_VTABLE_HASH;
  }
  if (pfVar7->each == (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)
  goto LAB_0015116d;
  if ((uVar5 & 6) == 0) {
    switch(*(undefined1 *)(uVar5 & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar7 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_00151144_caseD_28;
    case 0x29:
      pfVar7 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_00151144_caseD_2a;
    case 0x2b:
      pfVar7 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar7 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar3 == 2) {
switchD_00151144_caseD_28:
    pfVar7 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_00151144_caseD_2a:
    pfVar7 = &FIOBJECT_VTABLE_HASH;
  }
  (*pfVar7->each)(uVar5,0,write_header,local_30);
  dest = local_30[0];
LAB_0015116d:
  fiobj_str_write(dest,"\r\n",2);
  return local_30[0];
}

Assistant:

static FIOBJ headers2str(http_s *h, uintptr_t padding) {
  if (!h->method && !!h->status_str)
    return FIOBJ_INVALID;

  static uintptr_t connection_hash;
  if (!connection_hash)
    connection_hash = fiobj_hash_string("connection", 10);

  struct header_writer_s w;
  {
    const uintptr_t header_length_guess =
        fiobj_hash_count(h->private_data.out_headers) * 64;
    w.dest = fiobj_str_buf(header_length_guess + padding);
  }
  http1pr_s *p = handle2pr(h);

  if (p->is_client == 0) {
    fio_str_info_s t = http1pr_status2str(h->status);
    fiobj_str_write(w.dest, t.data, t.len);
    FIOBJ tmp = fiobj_hash_get2(h->private_data.out_headers, connection_hash);
    if (tmp) {
      t = fiobj_obj2cstr(tmp);
      if (t.data[0] == 'c' || t.data[0] == 'C')
        p->close = 1;
    } else {
      tmp = fiobj_hash_get2(h->headers, connection_hash);
      if (tmp) {
        t = fiobj_obj2cstr(tmp);
        if (!t.data || !t.len || t.data[0] == 'k' || t.data[0] == 'K')
          fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
        else {
          fiobj_str_write(w.dest, "connection:close\r\n", 18);
          p->close = 1;
        }
      } else {
        t = fiobj_obj2cstr(h->version);
        if (!p->close && t.len > 7 && t.data && t.data[5] == '1' &&
            t.data[6] == '.' && t.data[7] == '1')
          fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
        else {
          fiobj_str_write(w.dest, "connection:close\r\n", 18);
          p->close = 1;
        }
      }
    }
  } else {
    if (h->method) {
      fiobj_str_join(w.dest, h->method);
      fiobj_str_write(w.dest, " ", 1);
    } else {
      fiobj_str_write(w.dest, "GET ", 4);
    }
    fiobj_str_join(w.dest, h->path);
    if (h->query) {
      fiobj_str_write(w.dest, "?", 1);
      fiobj_str_join(w.dest, h->query);
    }
    fiobj_str_write(w.dest, " HTTP/1.1\r\n", 11);
    /* make sure we have a host header? */
    static uint64_t host_hash;
    if (!host_hash)
      host_hash = fiobj_hash_string("host", 4);
    FIOBJ tmp;
    if (!fiobj_hash_get2(h->private_data.out_headers, host_hash) &&
        (tmp = fiobj_hash_get2(h->headers, host_hash))) {
      fiobj_str_write(w.dest, "host:", 5);
      fiobj_str_join(w.dest, tmp);
      fiobj_str_write(w.dest, "\r\n", 2);
    }
    if (!fiobj_hash_get2(h->private_data.out_headers, connection_hash))
      fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
  }

  fiobj_each1(h->private_data.out_headers, 0, write_header, &w);
  fiobj_str_write(w.dest, "\r\n", 2);
  return w.dest;
}